

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.hpp
# Opt level: O0

void __thiscall SingletonDatabase::SingletonDatabase(SingletonDatabase *this)

{
  bool bVar1;
  ostream *this_00;
  istream *piVar2;
  unsigned_long_long uVar3;
  mapped_type *pmVar4;
  undefined1 local_268 [8];
  string num;
  string name;
  ifstream in;
  SingletonDatabase *this_local;
  
  IDatabase::IDatabase(&this->super_IDatabase);
  (this->super_IDatabase)._vptr_IDatabase = (_func_int **)&PTR_get_population_00107d48;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::unordered_map(&this->data);
  this_00 = std::operator<<((ostream *)&std::clog,"SingletonDatabase::SingletonDatabase()");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::ifstream::ifstream((undefined1 *)((long)&name.field_2 + 8),"resource.txt",8);
  std::__cxx11::string::string((string *)(num.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_268);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(name.field_2._M_local_buf + 8),
                        (string *)(num.field_2._M_local_buf + 8));
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(name.field_2._M_local_buf + 8),(string *)local_268);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (bVar1) {
      uVar3 = std::__cxx11::stoull((string *)local_268,(size_t *)0x0,10);
      pmVar4 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::operator[](&this->data,(key_type *)((long)&num.field_2 + 8));
      *pmVar4 = uVar3;
    }
  }
  std::__cxx11::string::~string((string *)local_268);
  std::__cxx11::string::~string((string *)(num.field_2._M_local_buf + 8));
  std::ifstream::~ifstream((void *)((long)&name.field_2 + 8));
  return;
}

Assistant:

SingletonDatabase()
	{
		std::clog << "SingletonDatabase::SingletonDatabase()" << std::endl;

		std::ifstream in("resource.txt");
		std::string name, num;
		while(std::getline(in, name))
		{
			if(std::getline(in, num))
			{
				data[name] = std::stoull(num);
			}
		}
	}